

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O0

int Fraig_MarkTfi3_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  int iVar1;
  int iVar2;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *pMan_local;
  
  if (pNode->TravId == pMan->nTravIds) {
    pMan_local._4_4_ = 1;
  }
  else if (pNode->TravId == pMan->nTravIds + -1) {
    pNode->TravId = pMan->nTravIds;
    pMan_local._4_4_ = 1;
  }
  else {
    pNode->TravId = pMan->nTravIds;
    if (pNode->NumPi < 0) {
      iVar1 = Fraig_MarkTfi3_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe));
      iVar2 = Fraig_MarkTfi3_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe));
      pMan_local._4_4_ = iVar1 * iVar2;
    }
    else {
      pMan_local._4_4_ = 0;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Fraig_MarkTfi3_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return 1;
    // skip the boundary node
    if ( pNode->TravId == pMan->nTravIds-1 )
    {
        pNode->TravId = pMan->nTravIds;
        return 1;
    }
    pNode->TravId = pMan->nTravIds;
    // skip the PI node
    if ( pNode->NumPi >= 0 )
        return 0;
    // check the children
    return Fraig_MarkTfi3_rec( pMan, Fraig_Regular(pNode->p1) ) *
           Fraig_MarkTfi3_rec( pMan, Fraig_Regular(pNode->p2) );
}